

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O2

ostream * IO::operator<<(ostream *output,Element *element)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(output,"(");
  poVar1 = std::operator<<(poVar1,(string *)element);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(element->atomicWeight_);
  std::operator<<(poVar1,")");
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Element& element)
    {
        output << "(" << element.name_ << ", " << element.atomicWeight_ << ")";
        return output;
    }